

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peeps.cpp
# Opt level: O2

Instr * __thiscall
Peeps::HoistSameInstructionAboveSplit(Peeps *this,BranchInstr *branchInstr,Instr *instrNext)

{
  IRKind IVar1;
  LabelInstr *oldLabelInstr;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Instr *pIVar5;
  BranchInstr *pBVar6;
  LabelInstr *pLVar7;
  Instr *pIVar8;
  Instr *pIVar9;
  Instr *pIVar10;
  BranchInstr *this_00;
  undefined4 *local_50;
  BranchInstr *local_40;
  Instr *local_38;
  
  if (branchInstr == (BranchInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                       ,0x2aa,"(branchInstr)","branchInstr");
    if (!bVar3) goto LAB_005ad7b1;
    *puVar4 = 0;
  }
  bVar3 = IR::BranchInstr::IsConditional(branchInstr);
  if (((bVar3) && (bVar3 = IR::BranchInstr::IsMultiBranch(branchInstr), !bVar3)) &&
     (MDStart < (branchInstr->super_Instr).m_opcode)) {
    oldLabelInstr = branchInstr->m_branchTarget;
    if (oldLabelInstr == (LabelInstr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                         ,0x2b1,"(targetLabel)","targetLabel");
      if (!bVar3) goto LAB_005ad7b1;
      *puVar4 = 0;
    }
    if (1 < (oldLabelInstr->labelRefs).
            super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
            super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount.
            count) {
      return instrNext;
    }
    pIVar5 = IR::Instr::GetPrevRealInstrOrLabel(&oldLabelInstr->super_Instr);
    if (pIVar5 == (Instr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                         ,699,"(targetPrev)","targetPrev");
      if (!bVar3) goto LAB_005ad7b1;
      *puVar4 = 0;
    }
    bVar3 = IR::Instr::HasFallThrough(pIVar5);
    if (!bVar3) {
      local_40 = (BranchInstr *)0x0;
      pBVar6 = branchInstr;
      while (pBVar6 = (BranchInstr *)IR::Instr::GetPrevRealInstrOrLabel(&pBVar6->super_Instr),
            pBVar6 != (BranchInstr *)0x0) {
        IVar1 = (pBVar6->super_Instr).m_kind;
        if ((IVar1 == InstrKindLabel) || (IVar1 == InstrKindProfiledLabel)) {
          pLVar7 = IR::Instr::AsLabelInstr((Instr *)pBVar6);
          if (local_40 == (BranchInstr *)0x0 || (pLVar7->field_0x78 & 2) != 0) {
            return instrNext;
          }
          goto LAB_005ad53a;
        }
        if (IVar1 == InstrKindEntry) break;
        if ((local_40 == (BranchInstr *)0x0) &&
           (bVar3 = EncoderMD::SetsConditionCode((Instr *)pBVar6), local_40 = pBVar6, !bVar3)) {
          local_40 = (BranchInstr *)0x0;
        }
      }
      if (local_40 != (BranchInstr *)0x0) {
LAB_005ad53a:
        pBVar6 = (BranchInstr *)IR::Instr::GetPrevRealInstrOrLabel(&branchInstr->super_Instr);
        pIVar8 = IR::Instr::GetNextRealInstrOrLabel(&branchInstr->super_Instr);
        pIVar5 = IR::Instr::GetNextRealInstrOrLabel(&oldLabelInstr->super_Instr);
        if (pIVar5 == (Instr *)0x0 || pIVar8 == (Instr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          local_50 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *local_50 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                             ,0x2e3,"(instr && targetInstr)","instr && targetInstr");
          if (!bVar3) {
LAB_005ad7b1:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *local_50 = 0;
        }
        else {
          local_50 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        }
        this_00 = branchInstr;
        if (local_40 == pBVar6) {
          this_00 = local_40;
        }
        local_38 = (Instr *)0x0;
        while (((((bVar3 = IR::Instr::EndsBasicBlock(pIVar8), !bVar3 &&
                  (pIVar8->m_kind != InstrKindLabel)) && (pIVar8->m_kind != InstrKindProfiledLabel))
                && ((bVar3 = IR::Instr::IsEqual(pIVar8,pIVar5), bVar3 &&
                    (bVar3 = EncoderMD::UsesConditionCode(pIVar8), !bVar3)))) &&
               ((bVar3 = EncoderMD::SetsConditionCode(pIVar8), !bVar3 &&
                ((bVar3 = AgenPeeps::DependentInstrs(&this->peepsAgen,&local_40->super_Instr,pIVar8)
                 , !bVar3 && (pIVar8->m_opcode != InlineeStart))))))) {
          pIVar9 = IR::Instr::GetNextRealInstrOrLabel(pIVar8);
          pIVar10 = IR::Instr::GetNextRealInstrOrLabel(pIVar5);
          IR::Instr::Unlink(pIVar8);
          IR::Instr::InsertBefore(&this_00->super_Instr,pIVar8);
          IR::Instr::Remove(pIVar5);
          if (local_38 == (Instr *)0x0) {
            local_38 = pIVar8;
          }
          pIVar5 = pIVar10;
          pIVar8 = pIVar9;
          if ((pIVar9 == (Instr *)0x0) || (pIVar10 == (Instr *)0x0)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *local_50 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                               ,0x2fe,"(instr && targetInstr)","instr && targetInstr");
            if (!bVar3) goto LAB_005ad7b1;
            *local_50 = 0;
          }
        }
        if ((local_38 != (Instr *)0x0) && (instrNext = local_38, pIVar5->m_kind == InstrKindBranch))
        {
          pBVar6 = IR::Instr::AsBranchInstr(pIVar5);
          bVar3 = IR::BranchInstr::IsUnconditional(pBVar6);
          if ((bVar3) && (bVar3 = IR::BranchInstr::IsMultiBranch(pBVar6), !bVar3)) {
            IR::BranchInstr::ReplaceTarget(branchInstr,oldLabelInstr,pBVar6->m_branchTarget);
          }
          if ((oldLabelInstr->field_0x78 & 4) == 0 &&
              (SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *)
              (oldLabelInstr->labelRefs).
              super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
              super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
              super_SListNodeBase<Memory::ArenaAllocator>.next == &oldLabelInstr->labelRefs) {
            PeepUnreachableLabel
                      (oldLabelInstr,(bool)((oldLabelInstr->field_0x78 & 2) >> 1),(bool *)0x0);
          }
        }
      }
    }
  }
  return instrNext;
}

Assistant:

IR::Instr *
Peeps::HoistSameInstructionAboveSplit(IR::BranchInstr *branchInstr, IR::Instr *instrNext)
{
    Assert(branchInstr);
    if (!branchInstr->IsConditional() || branchInstr->IsMultiBranch() || !branchInstr->IsLowered())
    {
        return instrNext;   // this optimization only applies to single conditional branch
    }

    IR::LabelInstr *targetLabel = branchInstr->GetTarget();
    Assert(targetLabel);

    // give up if there are other branch entries to the target label
    if (targetLabel->labelRefs.Count() > 1)
    {
        return instrNext;
    }

    // Give up if previous instruction before target label has fallthrough, cannot hoist up
    IR::Instr *targetPrev = targetLabel->GetPrevRealInstrOrLabel();
    Assert(targetPrev);
    if (targetPrev->HasFallThrough())
    {
        return instrNext;
    }

    IR::Instr *instrSetCondition = NULL;
    IR::Instr *branchPrev = branchInstr->GetPrevRealInstrOrLabel();
    while (branchPrev && !branchPrev->StartsBasicBlock())
    {
        if (!instrSetCondition && EncoderMD::SetsConditionCode(branchPrev))
        {   // located compare instruction for the branch
            instrSetCondition = branchPrev;
        }
        branchPrev = branchPrev->GetPrevRealInstrOrLabel(); // keep looking previous instr in BB
    }

    if (branchPrev && branchPrev->IsLabelInstr() && branchPrev->AsLabelInstr()->isOpHelper)
    {   // don't apply the optimization when branch is in helper section
        return instrNext;
    }

    if (!instrSetCondition)
    {   // give up if we cannot find the compare instruction in the BB, should be very rare
        return instrNext;
    }
    Assert(instrSetCondition);

    bool hoistAboveSetConditionInstr = false;
    if (instrSetCondition == branchInstr->GetPrevRealInstrOrLabel())
    {   // if compare instruction is right before branch instruction, we can hoist above cmp instr
        hoistAboveSetConditionInstr = true;
    }   // otherwise we hoist the identical instructions above conditional branch split only

    IR::Instr *instr = branchInstr->GetNextRealInstrOrLabel();
    IR::Instr *targetInstr = targetLabel->GetNextRealInstrOrLabel();
    IR::Instr *branchNextInstr = NULL;
    IR::Instr *targetNextInstr = NULL;
    IR::Instr *instrHasHoisted = NULL;

    Assert(instr && targetInstr);
    while (!instr->EndsBasicBlock() && !instr->IsLabelInstr() && instr->IsEqual(targetInstr) &&
        !EncoderMD::UsesConditionCode(instr) && !EncoderMD::SetsConditionCode(instr) &&
        !this->peepsAgen.DependentInstrs(instrSetCondition, instr) &&
        // cannot hoist InlineeStart from branch targets even for the same inlinee function.
        // it is used by encoder to generate InlineeFrameRecord for each inlinee
        instr->m_opcode != Js::OpCode::InlineeStart)
    {
        branchNextInstr = instr->GetNextRealInstrOrLabel();
        targetNextInstr = targetInstr->GetNextRealInstrOrLabel();

        instr->Unlink();                            // hoist up instr in fallthrough branch
        if (hoistAboveSetConditionInstr)
        {
            instrSetCondition->InsertBefore(instr); // hoist above compare instruction
        }
        else
        {
            branchInstr->InsertBefore(instr);       // hoist above branch split
        }
        targetInstr->Remove();                      // remove the same instruction in target branch

        if (!instrHasHoisted)
            instrHasHoisted = instr;                // points to the first hoisted instruction

        instr = branchNextInstr;
        targetInstr = targetNextInstr;
        Assert(instr && targetInstr);
    }

    if (instrHasHoisted)
    {   // instructions have been hoisted, now check tail branch to see if it can be duplicated
        if (targetInstr->IsBranchInstr())
        {
            IR::BranchInstr *tailBranch = targetInstr->AsBranchInstr();
            if (tailBranch->IsUnconditional() && !tailBranch->IsMultiBranch())
            {   // target can be replaced since tail branch is a single unconditional jmp
                branchInstr->ReplaceTarget(targetLabel, tailBranch->GetTarget());
            }

            // now targeLabel is an empty Basic Block, remove it if it's not referenced
            if (targetLabel->IsUnreferenced())
            {
                Peeps::PeepUnreachableLabel(targetLabel, targetLabel->isOpHelper);
            }
        }
        return instrHasHoisted;
    }

    return instrNext;
}